

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O2

void overview_scan(level *lev,overview_info *oi)

{
  char cVar1;
  ulong uVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  char cVar6;
  char cVar7;
  trap *ptVar8;
  byte *pbVar9;
  byte *pbVar10;
  char cVar11;
  char cVar12;
  ulong uVar13;
  byte bVar14;
  char cVar15;
  char cVar16;
  char local_88 [56];
  boolean seen_shop [80];
  
  seen_shop[8] = '\0';
  seen_shop[9] = '\0';
  seen_shop[10] = '\0';
  seen_shop[0xb] = '\0';
  seen_shop[0xc] = '\0';
  seen_shop[0xd] = '\0';
  seen_shop[0xe] = '\0';
  seen_shop[0xf] = '\0';
  seen_shop[0x10] = '\0';
  seen_shop[0x11] = '\0';
  seen_shop[0x12] = '\0';
  seen_shop[0x13] = '\0';
  seen_shop[0x14] = '\0';
  seen_shop[0x15] = '\0';
  seen_shop[0x16] = '\0';
  seen_shop[0x17] = '\0';
  local_88[0x30] = '\0';
  local_88[0x31] = '\0';
  local_88[0x32] = '\0';
  local_88[0x33] = '\0';
  local_88[0x34] = '\0';
  local_88[0x35] = '\0';
  local_88[0x36] = '\0';
  local_88[0x37] = '\0';
  seen_shop[0] = '\0';
  seen_shop[1] = '\0';
  seen_shop[2] = '\0';
  seen_shop[3] = '\0';
  seen_shop[4] = '\0';
  seen_shop[5] = '\0';
  seen_shop[6] = '\0';
  seen_shop[7] = '\0';
  local_88[0x20] = '\0';
  local_88[0x21] = '\0';
  local_88[0x22] = '\0';
  local_88[0x23] = '\0';
  local_88[0x24] = '\0';
  local_88[0x25] = '\0';
  local_88[0x26] = '\0';
  local_88[0x27] = '\0';
  local_88[0x28] = '\0';
  local_88[0x29] = '\0';
  local_88[0x2a] = '\0';
  local_88[0x2b] = '\0';
  local_88[0x2c] = '\0';
  local_88[0x2d] = '\0';
  local_88[0x2e] = '\0';
  local_88[0x2f] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  oi->fountains = '\0';
  oi->magic_chests = '\0';
  oi->sinks = '\0';
  oi->thrones = '\0';
  oi->trees = '\0';
  oi->temples = '\0';
  oi->altars = '\0';
  oi->altaralign = '\0';
  oi->shopcount = '\0';
  oi->shoptype = '\0';
  oi->branch = '\0';
  oi->portal = '\0';
  (oi->branch_dst).dnum = '\0';
  (oi->branch_dst).dlevel = '\0';
  (oi->portal_dst).dnum = '\0';
  (oi->portal_dst).dlevel = '\0';
  oi->branch_dst_known = '\0';
  oi->portal_dst_known = '\0';
  if (lev != (level *)0x0) {
    pbVar10 = &lev->locations[0][0].field_0x6;
    cVar3 = '\0';
    cVar6 = '\0';
    cVar15 = '\0';
    cVar16 = '\0';
    cVar4 = '\0';
    bVar14 = 0;
    cVar7 = '\0';
    cVar12 = '\0';
    cVar11 = '\0';
    for (uVar2 = 0; uVar2 != 0x15; uVar2 = uVar2 + 1) {
      pbVar9 = pbVar10;
      for (uVar13 = 0; uVar13 != 0x50; uVar13 = uVar13 + 1) {
        if (pbVar9[-1] != 0) {
          switch(*(uint *)(pbVar9 + -6) & 0x3f) {
          case 0xf:
            uVar5 = *(ushort *)(pbVar9 + 2) & 0x3f;
            if ((((2 < uVar5) &&
                 (((lev->z).dnum != dungeon_topology.d_blackmarket_level.dnum ||
                  ((lev->z).dlevel != dungeon_topology.d_blackmarket_level.dlevel)))) &&
                (cVar1 = lev->rooms[uVar5 - 3].rtype, '\x11' < cVar1)) && (local_88[uVar5] == '\0'))
            {
              local_88[uVar5] = '\x01';
              oi->shoptype = -(cVar11 != '\0') | cVar1 - 0x12U;
              cVar11 = cVar11 + '\x01';
              oi->shopcount = cVar11;
            }
            break;
          case 0x1e:
            cVar12 = cVar12 + '\x01';
            oi->trees = cVar12;
            break;
          case 0x20:
          case 0x21:
          case 0x22:
          case 0x23:
          case 0x24:
          case 0x25:
            if (((uVar13 == (uint)(int)(lev->sstairs).sx) && (uVar2 == (uint)(int)(lev->sstairs).sy)
                ) && (cVar1 = (lev->sstairs).tolev.dnum, cVar1 != (lev->z).dnum)) {
              oi->branch = '\x01';
              if (levels[(char)((lev->sstairs).tolev.dlevel + (char)dungeons[cVar1].ledger_start)]
                  == (level *)0x0) {
                oi->branch_dst_known = '\0';
              }
              else {
                oi->branch_dst_known = '\x01';
                oi->branch_dst = (lev->sstairs).tolev;
              }
            }
            break;
          case 0x26:
            cVar7 = cVar7 + '\x01';
            oi->altars = cVar7;
            bVar14 = bVar14 | *pbVar9 >> 4 & 7;
            oi->altaralign = bVar14;
            if ((2 < (*(ushort *)(pbVar9 + 2) & 0x3f)) &&
               (lev->rooms[(*(ushort *)(pbVar9 + 2) & 0x3f) - 3].rtype == '\n')) {
              cVar4 = cVar4 + '\x01';
              oi->temples = cVar4;
            }
            break;
          case 0x28:
            cVar15 = cVar15 + '\x01';
            oi->thrones = cVar15;
            break;
          case 0x29:
            cVar16 = cVar16 + '\x01';
            oi->magic_chests = cVar16;
            break;
          case 0x2a:
            cVar6 = cVar6 + '\x01';
            oi->sinks = cVar6;
            break;
          case 0x2b:
            cVar3 = cVar3 + '\x01';
            oi->fountains = cVar3;
          }
        }
        pbVar9 = pbVar9 + 0xfc;
      }
      pbVar10 = pbVar10 + 0xc;
    }
    ptVar8 = (trap *)&lev->lev_traps;
    while (ptVar8 = ptVar8->ntrap, ptVar8 != (trap *)0x0) {
      if ((ptVar8->field_0x8 & 0x3f) == 0x32) {
        oi->portal = '\x01';
        if (levels[(char)((ptVar8->dst).dlevel + (char)dungeons[(ptVar8->dst).dnum].ledger_start)]
            == (level *)0x0) {
          oi->portal_dst_known = '\0';
        }
        else {
          oi->portal_dst_known = '\x01';
          oi->portal_dst = ptVar8->dst;
        }
      }
    }
  }
  return;
}

Assistant:

static void overview_scan(const struct level *lev, struct overview_info *oi)
{
	int x, y, rnum, rtyp;
	struct trap *trap;
	boolean seen_shop[MAXNROFROOMS * 2];
	
	memset(seen_shop, 0, sizeof(seen_shop));
	memset(oi, 0, sizeof(struct overview_info));
	if (!lev)
	    return;
	
	for (y = 0; y < ROWNO; y++) {
	    for (x = 0; x < COLNO; x++) {
		if (!lev->locations[x][y].seenv)
		    continue;
		
		switch (lev->locations[x][y].mem_bg) {
		    case S_upstair: case S_dnstair:
		    case S_upladder: case S_dnladder:
		    case S_upsstair: case S_dnsstair:
			if (lev->sstairs.sx == x && lev->sstairs.sy == y &&
			    lev->sstairs.tolev.dnum != lev->z.dnum) {
			    oi->branch = TRUE;
			    if (levels[ledger_no(&lev->sstairs.tolev)]) {
				oi->branch_dst_known = TRUE;
				oi->branch_dst = lev->sstairs.tolev;
			    } else {
				oi->branch_dst_known = FALSE;
			    }
			}
			break;
		    
		    case S_fountain:
			oi->fountains++;
			break;
			
		    case S_sink:
			oi->sinks++;
			break;
			
		    case S_throne:
			oi->thrones++; /* don't care about throne rooms */
			break;

		    case S_magic_chest:
			oi->magic_chests++;
			break;

		    case S_altar:
			oi->altars++;
			oi->altaralign |= (lev->locations[x][y].altarmask & AM_MASK);
			rnum = lev->locations[x][y].roomno;
			if (rnum >= ROOMOFFSET &&
			    lev->rooms[rnum - ROOMOFFSET].rtype == TEMPLE)
			    oi->temples++;
			break;
			
		    case S_tree:
			oi->trees++;
			break;
			
		    case S_room:
			rnum = lev->locations[x][y].roomno;
			if (rnum < ROOMOFFSET)
			    break;
			
			/* Black Market implies the shop, so
			 * there's no need to record it here.
			 */
			if (Is_blackmarket(&lev->z))
			    break;
			
			rtyp = lev->rooms[rnum - ROOMOFFSET].rtype;
			if (rtyp >= SHOPBASE && !seen_shop[rnum]) {
			    seen_shop[rnum] = TRUE;
			    if (oi->shopcount == 0)
				oi->shoptype = rtyp - SHOPBASE;
			    else
				oi->shoptype = -1; /* multiple shops */
			    oi->shopcount++;
			}
		}
	    }
	}
	
	/* find the magic portal, if it exists */
	for (trap = lev->lev_traps; trap; trap = trap->ntrap) {
	    if (trap->tseen && trap->ttyp == MAGIC_PORTAL) {
		oi->portal = TRUE;
		if (levels[ledger_no(&trap->dst)]) {
		    oi->portal_dst_known = TRUE;
		    oi->portal_dst = trap->dst;
		} else {
		    oi->portal_dst_known = FALSE;
		}
	    }
	}
}